

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O0

void LoadFileList(Configuration *config,
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
                 *components,
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>_>
                 *files,path *sourceDir,bool inferredComponents,bool withLoc)

{
  type_conflict tVar1;
  bool bVar2;
  Configuration *config_00;
  pointer pdVar3;
  string *psVar4;
  ulong uVar5;
  char *pcVar6;
  pointer this;
  path *this_00;
  long lVar7;
  directory_entry *in_RDX;
  byte in_R8B;
  byte in_R9B;
  undefined1 unaff_retaddr;
  path *in_stack_00000008;
  string *in_stack_00000010;
  string fileName;
  path *parent;
  recursive_directory_iterator end;
  recursive_directory_iterator it;
  path outputpath;
  path *in_stack_00000290;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
  *in_stack_00000298;
  Configuration *in_stack_000002a0;
  directory_entry *in_stack_fffffffffffffda8;
  pointer in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffdb8;
  byte in_stack_fffffffffffffdbf;
  string *in_stack_fffffffffffffdc0;
  pointer in_stack_fffffffffffffdc8;
  Component *in_stack_fffffffffffffdd0;
  value_type *in_stack_fffffffffffffdd8;
  path *in_stack_fffffffffffffde0;
  path local_180 [2];
  path local_138;
  string local_118 [32];
  undefined1 local_f8 [32];
  undefined1 *local_d8;
  undefined4 local_cc;
  byte local_22;
  byte local_21;
  directory_entry *local_18;
  
  local_21 = in_R8B & 1;
  local_22 = in_R9B & 1;
  local_18 = in_RDX;
  boost::filesystem::current_path();
  boost::filesystem::path::c_str((path *)0x19c662);
  boost::filesystem::path::path(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  boost::filesystem::current_path((path *)0x19c681);
  boost::filesystem::path::~path((path *)0x19c690);
  boost::filesystem::path::path(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  AddComponentDefinition
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
              *)in_stack_fffffffffffffdd0,(path *)in_stack_fffffffffffffdc8);
  boost::filesystem::path::~path((path *)0x19c6da);
  boost::filesystem::path::path(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  boost::filesystem::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)in_stack_fffffffffffffdc0,
             (path *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
  boost::filesystem::path::~path((path *)0x19c714);
  boost::filesystem::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)0x19c721);
  do {
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                        *)in_stack_fffffffffffffdc0,
                       (iterator_facade<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                        *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    if (!tVar1) {
      local_cc = 2;
      boost::filesystem::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)0x19c768);
      boost::filesystem::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)0x19c775);
      boost::filesystem::current_path((path *)0x19ccef);
      boost::filesystem::path::~path((path *)0x19ccfe);
      return;
    }
    config_00 = (Configuration *)
                boost::iterators::detail::
                iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                ::operator->((iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                              *)0x19c82b);
    boost::filesystem::directory_entry::path((directory_entry *)config_00);
    boost::filesystem::path::parent_path();
    local_d8 = local_f8;
    pdVar3 = boost::iterators::detail::
             iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
             ::operator->((iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                           *)0x19c871);
    boost::filesystem::directory_entry::path(pdVar3);
    boost::filesystem::path::filename();
    psVar4 = boost::filesystem::path::generic_string_abi_cxx11_(&local_138);
    std::__cxx11::string::string(local_118,(string *)psVar4);
    boost::filesystem::path::~path((path *)0x19c8d5);
    uVar5 = std::__cxx11::string::size();
    if ((uVar5 < 2) ||
       (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_118), *pcVar6 != '.')) {
      this = boost::iterators::detail::
             iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
             ::operator->((iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                           *)0x19c92d);
      boost::filesystem::directory_entry::path(this);
      bVar2 = IsItemBlacklisted(config_00,(path *)pdVar3);
      if (bVar2) goto LAB_0019c961;
      if ((local_21 & 1) != 0) {
        AddComponentDefinition
                  ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
                    *)in_stack_fffffffffffffdd0,(path *)in_stack_fffffffffffffdc8);
      }
      pdVar3 = boost::iterators::detail::
               iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
               ::operator->((iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                             *)0x19ca0b);
      boost::filesystem::directory_entry::path(pdVar3);
      boost::filesystem::path::filename();
      bVar2 = boost::filesystem::operator==
                        ((path *)in_stack_fffffffffffffdb0,(value_type *)in_stack_fffffffffffffda8);
      boost::filesystem::path::~path((path *)0x19ca55);
      if (bVar2) {
        pdVar3 = boost::iterators::detail::
                 iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                 ::operator->((iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                               *)0x19ca86);
        boost::filesystem::directory_entry::path(pdVar3);
        ReadCmakelist(in_stack_000002a0,in_stack_00000298,in_stack_00000290);
      }
      else {
        boost::iterators::detail::
        iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
        ::operator->((iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                      *)0x19cae3);
        boost::filesystem::directory_entry::status(in_stack_fffffffffffffda8);
        bVar2 = boost::filesystem::is_regular_file((file_status *)0x19cb0b);
        if (bVar2) {
          pdVar3 = boost::iterators::detail::
                   iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                   ::operator->((iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                                 *)0x19cb21);
          this_00 = boost::filesystem::directory_entry::path(pdVar3);
          psVar4 = boost::filesystem::path::generic_string_abi_cxx11_(this_00);
          lVar7 = std::__cxx11::string::find((char *)psVar4,0x1ae99d);
          if (lVar7 == -1) {
            in_stack_fffffffffffffdc8 =
                 boost::iterators::detail::
                 iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                 ::operator->((iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                               *)0x19cb96);
            boost::filesystem::directory_entry::path(in_stack_fffffffffffffdc8);
            boost::filesystem::path::extension();
            in_stack_fffffffffffffdc0 =
                 boost::filesystem::path::generic_string_abi_cxx11_(local_180);
            in_stack_fffffffffffffdbf = IsCode(in_stack_00000010);
            boost::filesystem::path::~path((path *)0x19cbea);
            if ((in_stack_fffffffffffffdbf & 1) != 0) {
              in_stack_fffffffffffffda8 = local_18;
              in_stack_fffffffffffffdb0 =
                   boost::iterators::detail::
                   iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                   ::operator->((iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                                 *)0x19cc0d);
              boost::filesystem::directory_entry::path(in_stack_fffffffffffffdb0);
              ReadCode((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>_>
                        *)in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
            }
          }
          else {
            in_stack_fffffffffffffdd0 =
                 AddComponentDefinition
                           ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
                             *)in_stack_fffffffffffffdd0,(path *)in_stack_fffffffffffffdc8);
            in_stack_fffffffffffffdd0->hasAddonCmake = true;
          }
        }
      }
      local_cc = 0;
    }
    else {
LAB_0019c961:
      boost::filesystem::recursive_directory_iterator::no_push
                ((recursive_directory_iterator *)in_stack_fffffffffffffdb0,
                 SUB81((ulong)in_stack_fffffffffffffda8 >> 0x38,0));
      local_cc = 4;
    }
    std::__cxx11::string::~string(local_118);
    boost::filesystem::path::~path((path *)0x19cc87);
    boost::iterators::detail::
    iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::filesystem::recursive_directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                  *)in_stack_fffffffffffffdb0);
  } while( true );
}

Assistant:

void LoadFileList(const Configuration& config,
                  std::unordered_map<std::string, Component *> &components,
                  std::unordered_map<std::string, File>& files,
                  const filesystem::path& sourceDir,
                  bool inferredComponents,
                  bool withLoc) {
    filesystem::path outputpath = filesystem::current_path();
    filesystem::current_path(sourceDir.c_str());
    AddComponentDefinition(components, ".");
    for (filesystem::recursive_directory_iterator it("."), end;
         it != end; ++it) {
        const auto &parent = it->path().parent_path();

        // skip hidden files and dirs
        std::string fileName = it->path().filename().generic_string();
        if ((fileName.size() >= 2 && fileName[0] == '.') ||
            IsItemBlacklisted(config, it->path())) {
#ifdef WITH_BOOST
            it.no_push();
#else
            it.disable_recursion_pending();
#endif
            continue;
        }       

        if (inferredComponents) AddComponentDefinition(components, parent);

        if (it->path().filename() == "CMakeLists.txt") {
            ReadCmakelist(config, components, it->path());
        } else if (filesystem::is_regular_file(it->status())) {
            if (it->path().generic_string().find("CMakeAddon.txt") != std::string::npos) {
                AddComponentDefinition(components, parent).hasAddonCmake = true;
            } else if (IsCode(it->path().extension().generic_string())) {
                ReadCode(files, it->path(), withLoc);
            }
        }
    }
    filesystem::current_path(outputpath);
}